

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEditPrivate::adjustScrollbars(QPlainTextEditPrivate *this)

{
  undefined1 uVar1;
  long lVar2;
  QWidgetData *pQVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  QObject *object;
  QPlainTextDocumentLayout *pQVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  double dVar12;
  QRect QVar13;
  double local_a8;
  int local_9c;
  undefined1 local_68 [8];
  double dStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  QWidgetData *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  object = (QObject *)QTextDocument::documentLayout();
  pQVar8 = QtPrivate::qobject_cast_helper<QPlainTextDocumentLayout*,QObject>(object);
  uVar1 = *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb9);
  *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb9) = 1;
  dVar12 = (double)QTextDocument::documentMargin();
  if (((this->field_0x348 & 8) != 0) || ((*(byte *)(*(long *)(lVar2 + 0x20) + 9) & 0x80) == 0)) {
    iVar6 = QTextDocument::lineCount();
    iVar7 = 1;
    if (1 < iVar6) {
      iVar7 = iVar6;
    }
    QWidget::fontMetrics((QWidget *)local_68);
    local_9c = QFontMetrics::lineSpacing();
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_68);
    iVar6 = iVar7 + -1;
    if (local_9c == 0) {
      local_9c = 0;
    }
    else {
      pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      local_9c = (((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1) / local_9c;
    }
    goto LAB_00459004;
  }
  local_48 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::lastBlock();
  QVar13 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  dVar12 = ((double)((QVar13.y2.m_i.m_i - QVar13.y1.m_i) + 1) - dVar12) + -1.0;
  local_a8 = 0.0;
  local_9c = 0;
  while (cVar5 = QTextBlock::isValid(), cVar5 != '\0') {
    cVar5 = QTextBlock::isVisible();
    if (cVar5 == '\0') {
      QTextBlock::previous();
      local_48 = (QWidgetData *)local_68;
      puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,dStack_60._0_4_);
    }
    else {
      (**(code **)(*(long *)pQVar8 + 0x88))(local_68,pQVar8,&local_48);
      local_a8 = local_a8 + (double)CONCAT44(uStack_4c,uStack_50);
      iVar7 = QTextBlock::layout();
      iVar6 = QTextLayout::lineCount();
      if (dVar12 < local_a8) {
        iVar9 = 0;
        if (0 < iVar6) {
          iVar9 = iVar6;
        }
        iVar4 = 0;
        goto LAB_00459136;
      }
      local_9c = local_9c + iVar6;
      QTextBlock::previous();
      local_48 = (QWidgetData *)local_68;
      puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,dStack_60._0_4_);
    }
  }
  goto LAB_00458feb;
  while( true ) {
    QTextLayout::lineAt(iVar7);
    local_58._0_1_ = (QPaintDevice)0xff;
    local_58._1_3_ = 0xffffff;
    uStack_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    local_68 = (undefined1  [8])0xffffffffffffffff;
    dStack_60 = -NAN;
    QTextLine::naturalTextRect();
    iVar4 = iVar11 + 1;
    iVar10 = iVar11;
    if (local_a8 - dVar12 <= dStack_60) break;
LAB_00459136:
    iVar11 = iVar4;
    iVar10 = iVar9;
    if (iVar9 == iVar11) break;
  }
  iVar7 = iVar6 - iVar10;
  if (iVar6 - iVar10 == 0 || iVar6 < iVar10) {
    iVar7 = 0;
  }
  local_9c = local_9c + iVar7;
LAB_00458feb:
  iVar7 = QTextDocument::lineCount();
  iVar6 = 0;
  if (0 < iVar7 - local_9c) {
    iVar6 = iVar7 - local_9c;
  }
LAB_00459004:
  dVar12 = (double)(**(code **)(*(long *)pQVar8 + 0x78))(pQVar8);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,iVar6);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,local_9c);
  local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  dStack_60 = (double)&DAT_aaaaaaaaaaaaaaaa;
  QPlainTextEdit::firstVisibleBlock((QPlainTextEdit *)local_68);
  cVar5 = QTextBlock::isValid();
  if (cVar5 != '\0') {
    iVar6 = QTextBlock::firstLineNumber();
    iVar6 = iVar6 + this->topLine;
  }
  QAbstractSlider::setValue
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar6);
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,
             ~(pQVar3->crect).x2.m_i + (int)dVar12 + (pQVar3->crect).x1.m_i);
  pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,
             ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1);
  *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb9) = uVar1;
  iVar7 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  setTopLine(this,iVar7,0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::adjustScrollbars()
{
    Q_Q(QPlainTextEdit);
    QTextDocument *doc = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(doc->documentLayout());
    Q_ASSERT(documentLayout);
    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;
    qreal margin = doc->documentMargin();

    int vmax = 0;

    int vSliderLength = 0;
    if (!centerOnScroll && q->isVisible()) {
        QTextBlock block = doc->lastBlock();
        const qreal visible = viewport->rect().height() - margin - 1;
        qreal y = 0;
        int visibleFromBottom = 0;

        while (block.isValid()) {
            if (!block.isVisible()) {
                block = block.previous();
                continue;
            }
            y += documentLayout->blockBoundingRect(block).height();

            QTextLayout *layout = block.layout();
            int layoutLineCount = layout->lineCount();
            if (y > visible) {
                int lineNumber = 0;
                while (lineNumber < layoutLineCount) {
                    QTextLine line = layout->lineAt(lineNumber);
                    const QRectF lr = line.naturalTextRect();
                    if (lr.top() >= y - visible)
                        break;
                    ++lineNumber;
                }
                if (lineNumber < layoutLineCount)
                    visibleFromBottom += (layoutLineCount - lineNumber);
                break;

            }
            visibleFromBottom += layoutLineCount;
            block = block.previous();
        }
        vmax = qMax(0, doc->lineCount() - visibleFromBottom);
        vSliderLength = visibleFromBottom;

    } else {
        vmax = qMax(0, doc->lineCount() - 1);
        int lineSpacing = q->fontMetrics().lineSpacing();
        vSliderLength = lineSpacing != 0 ? viewport->height() / lineSpacing : 0;
    }

    QSizeF documentSize = documentLayout->documentSize();
    vbar->setRange(0, qMax(0, vmax));
    vbar->setPageStep(vSliderLength);
    int visualTopLine = vmax;
    QTextBlock firstVisibleBlock = q->firstVisibleBlock();
    if (firstVisibleBlock.isValid())
        visualTopLine = firstVisibleBlock.firstLineNumber() + topLine;

    vbar->setValue(visualTopLine);

    hbar->setRange(0, (int)documentSize.width() - viewport->width());
    hbar->setPageStep(viewport->width());
    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    setTopLine(vbar->value());
}